

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Trivia::withLocation
          (Trivia *this,BumpAllocator *alloc,SourceLocation anchorLocation)

{
  byte *pbVar1;
  Trivia TVar2;
  FullLocation *this_00;
  SourceLocation SVar3;
  Trivia *in_RDI;
  string_view sVar4;
  FullLocation *resultLocation;
  Trivia result;
  SourceLocation *in_stack_ffffffffffffffb8;
  size_t local_40;
  char *local_38;
  anon_union_12_4_39e54f29_for_Trivia_0 local_10;
  undefined1 uStack_4;
  TriviaKind TStack_3;
  undefined2 uStack_2;
  
  if ((byte)(in_RDI->kind - SkippedTokens) < 3) {
    pbVar1 = *(byte **)((long)&in_RDI->field_0 + 8);
    local_10.rawText.len = (uint32_t)pbVar1;
    uStack_4 = (undefined1)((ulong)pbVar1 >> 0x20);
    TStack_3 = (TriviaKind)((ulong)pbVar1 >> 0x28);
    uStack_2 = (undefined2)((ulong)pbVar1 >> 0x30);
    local_10.rawText.ptr = (char *)(FullLocation *)(in_RDI->field_0).rawText.ptr;
  }
  else {
    this_00 = BumpAllocator::emplace<slang::parsing::Trivia::FullLocation>((BumpAllocator *)in_RDI);
    sVar4 = getRawText(in_RDI);
    local_40 = sVar4._M_len;
    (this_00->text)._M_len = local_40;
    local_38 = sVar4._M_str;
    (this_00->text)._M_str = local_38;
    std::basic_string_view<char,_std::char_traits<char>_>::size(&this_00->text);
    SVar3 = SourceLocation::operator-<unsigned_long>
                      (in_stack_ffffffffffffffb8,(unsigned_long)in_RDI);
    this_00->location = SVar3;
    Trivia((Trivia *)&local_10.rawText);
    TStack_3 = in_RDI->kind;
    uStack_4 = 1;
    local_10.fullLocation = this_00;
  }
  TVar2.field_0.rawText.len = local_10.rawText.len;
  TVar2.field_0.rawText.ptr = local_10.rawText.ptr;
  TVar2.hasFullLocation = (bool)uStack_4;
  TVar2.kind = TStack_3;
  TVar2._14_2_ = uStack_2;
  return TVar2;
}

Assistant:

Trivia Trivia::withLocation(BumpAllocator& alloc, SourceLocation anchorLocation) const {
    switch (kind) {
        case TriviaKind::Directive:
        case TriviaKind::SkippedSyntax:
        case TriviaKind::SkippedTokens:
            return *this;
        default:
            break;
    }

    auto resultLocation = alloc.emplace<FullLocation>();
    resultLocation->text = getRawText();
    resultLocation->location = anchorLocation - resultLocation->text.size();

    Trivia result;
    result.kind = kind;
    result.hasFullLocation = true;
    result.fullLocation = resultLocation;
    return result;
}